

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall
duckdb::Vector::FindResizeInfos
          (Vector *this,vector<duckdb::ResizeInfo,_true> *resize_infos,idx_t multiplier)

{
  VectorBufferType VVar1;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *puVar2;
  VectorBuffer *pVVar3;
  type this_00;
  pointer this_01;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child;
  buffer_ptr<VectorBuffer> *this_02;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_03;
  ResizeInfo resize_info;
  __shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  ResizeInfo local_48;
  
  local_48.data = this->data;
  local_48.buffer.ptr =
       (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_48.vec = this;
  local_48.multiplier = multiplier;
  ::std::vector<duckdb::ResizeInfo,std::allocator<duckdb::ResizeInfo>>::
  emplace_back<duckdb::ResizeInfo&>
            ((vector<duckdb::ResizeInfo,std::allocator<duckdb::ResizeInfo>> *)resize_infos,&local_48
            );
  if (this->data == (data_ptr_t)0x0) {
    this_02 = &this->auxiliary;
    ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_58,(__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)this_02)
    ;
    pVVar3 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                       ((shared_ptr<duckdb::VectorBuffer,_true> *)&_Stack_58);
    VVar1 = pVVar3->buffer_type;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
    if (VVar1 == STRUCT_BUFFER) {
      pVVar3 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_02);
      puVar2 = *(unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> **)
                &pVVar3[1].buffer_type;
      for (this_03 = (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                     pVVar3[1]._vptr_VectorBuffer; this_03 != puVar2; this_03 = this_03 + 1) {
        this_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (this_03);
        FindResizeInfos(this_01,resize_infos,multiplier);
      }
    }
    else {
      if (VVar1 == LIST_BUFFER) {
        pVVar3 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_02);
      }
      else {
        if (VVar1 != ARRAY_BUFFER) {
          return;
        }
        pVVar3 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_02);
        multiplier = multiplier * *(long *)&pVVar3[1].buffer_type;
      }
      this_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                           (pVVar3 + 1));
      FindResizeInfos(this_00,resize_infos,multiplier);
    }
  }
  return;
}

Assistant:

void Vector::FindResizeInfos(vector<ResizeInfo> &resize_infos, const idx_t multiplier) {

	ResizeInfo resize_info(*this, data, buffer.get(), multiplier);
	resize_infos.emplace_back(resize_info);

	// Base case.
	if (data) {
		return;
	}

	D_ASSERT(auxiliary);
	switch (GetAuxiliary()->GetBufferType()) {
	case VectorBufferType::LIST_BUFFER: {
		auto &vector_list_buffer = auxiliary->Cast<VectorListBuffer>();
		auto &child = vector_list_buffer.GetChild();
		child.FindResizeInfos(resize_infos, multiplier);
		break;
	}
	case VectorBufferType::STRUCT_BUFFER: {
		auto &vector_struct_buffer = auxiliary->Cast<VectorStructBuffer>();
		auto &children = vector_struct_buffer.GetChildren();
		for (auto &child : children) {
			child->FindResizeInfos(resize_infos, multiplier);
		}
		break;
	}
	case VectorBufferType::ARRAY_BUFFER: {
		// We need to multiply the multiplier by the array size because
		// the child vectors of ARRAY types are always child_count * array_size.
		auto &vector_array_buffer = auxiliary->Cast<VectorArrayBuffer>();
		auto new_multiplier = vector_array_buffer.GetArraySize() * multiplier;
		auto &child = vector_array_buffer.GetChild();
		child.FindResizeInfos(resize_infos, new_multiplier);
		break;
	}
	default:
		break;
	}
}